

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O2

int Sbd_ManCutIsTopo_rec(Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  
  iVar1 = Vec_IntEntry(vMirrors,iObj);
  if (-1 < iVar1) {
    iVar1 = Vec_IntEntry(vMirrors,iObj);
    iObj = Abc_Lit2Var(iVar1);
  }
  uVar5 = 1;
  if (iObj != 0) {
    iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
    if (iVar1 == 0) {
      Gia_ObjSetTravIdCurrentId(p,iObj);
      pGVar4 = Gia_ManObj(p,iObj);
      uVar2 = (uint)*(undefined8 *)pGVar4;
      uVar5 = 0;
      if ((~uVar2 & 0x9fffffff) != 0) {
        if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                        ,0x8e,"int Sbd_ManCutIsTopo_rec(Gia_Man_t *, Vec_Int_t *, int)");
        }
        iVar1 = Sbd_ManCutIsTopo_rec(p,vMirrors,iObj - (uVar2 & 0x1fffffff));
        iVar3 = Sbd_ManCutIsTopo_rec(p,vMirrors,iObj - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
        uVar5 = (uint)(iVar3 != 0 && iVar1 != 0);
      }
    }
  }
  return uVar5;
}

Assistant:

int Sbd_ManCutIsTopo_rec( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj )
{
    Gia_Obj_t * pObj; 
    int Ret0, Ret1;
    if ( Vec_IntEntry(vMirrors, iObj) >= 0 )
        iObj = Abc_Lit2Var(Vec_IntEntry(vMirrors, iObj));
    if ( !iObj || Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 1;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    Ret0 = Sbd_ManCutIsTopo_rec( p, vMirrors, Gia_ObjFaninId0(pObj, iObj) );
    Ret1 = Sbd_ManCutIsTopo_rec( p, vMirrors, Gia_ObjFaninId1(pObj, iObj) );
    return Ret0 && Ret1;
}